

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

optional<pbrt::QuadricIntersection> * __thiscall
pbrt::Cylinder::BasicIntersect(Cylinder *this,Ray *r,Float tMax)

{
  undefined1 auVar1 [16];
  bool bVar2;
  long in_RSI;
  Interval<float> in_RDI;
  float in_XMM0_Da;
  float fVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar41 [56];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  Vector3<float> VVar42;
  Point3<float> PVar43;
  Float hitRad_1;
  Point3fi *in_stack_000000e8;
  Transform *in_stack_000000f0;
  Float hitRad;
  FloatInterval tShapeHit;
  FloatInterval q;
  FloatInterval rootDiscrim;
  FloatInterval discrim;
  FloatInterval sqrtf;
  FloatInterval fy;
  FloatInterval fx;
  FloatInterval f;
  FloatInterval c;
  FloatInterval b;
  FloatInterval a;
  FloatInterval t1;
  FloatInterval t0;
  Vector3fi di;
  Point3fi oi;
  Point3f pHit;
  Float phi;
  undefined4 in_stack_fffffffffffffc28;
  float in_stack_fffffffffffffc2c;
  optional<pbrt::QuadricIntersection> *in_stack_fffffffffffffc30;
  Interval<float> in_stack_fffffffffffffc38;
  Point3<pbrt::Interval<float>_> *p;
  undefined4 in_stack_fffffffffffffc40;
  float in_stack_fffffffffffffc44;
  Interval<float> in_stack_fffffffffffffc48;
  Tuple3<pbrt::Vector3,_float> *t;
  Point3fi *in_stack_fffffffffffffc50;
  Interval<float> i;
  Interval<float> *this_00;
  Interval<float> i_00;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 uVar44;
  Interval<float> i_01;
  undefined1 local_2ec [28];
  Point3<pbrt::Interval<float>_> local_2d0;
  Interval<float> local_2b8;
  float local_2ac;
  undefined8 local_2a8;
  float local_2a0;
  undefined8 local_298;
  float local_290;
  Tuple3<pbrt::Vector3,_float> local_284;
  undefined8 local_278;
  float local_270;
  undefined1 local_268 [12];
  undefined8 local_25c;
  float local_254;
  Interval<float> local_250;
  undefined8 local_248;
  Interval<float> local_240;
  undefined8 local_238;
  Interval<float> local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  Interval<float> local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  Interval<float> local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  Interval<float> local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  Interval<float> local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  Interval<float> local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_a8;
  Interval<float> local_a0;
  Interval<float> local_98 [4];
  undefined4 in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  float in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined8 local_44;
  undefined8 local_3c;
  undefined8 local_2c;
  float local_24;
  float local_20;
  float local_1c;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  undefined1 extraout_var_15 [56];
  undefined1 extraout_var_16 [56];
  undefined1 extraout_var_17 [56];
  undefined1 extraout_var_18 [56];
  undefined1 extraout_var_19 [56];
  undefined1 extraout_var_20 [56];
  undefined1 extraout_var_21 [56];
  undefined1 extraout_var_22 [56];
  undefined1 extraout_var_23 [56];
  undefined1 extraout_var_24 [56];
  undefined1 extraout_var_25 [56];
  undefined1 extraout_var_26 [56];
  undefined1 extraout_var_27 [56];
  undefined1 extraout_var_28 [56];
  
  i = in_RDI;
  local_1c = in_XMM0_Da;
  Point3<float>::Point3((Point3<float> *)0x7ee2f2);
  Point3fi::Point3fi(in_stack_fffffffffffffc50,(Point3f *)in_stack_fffffffffffffc48);
  i_01 = (Interval<float>)&local_44;
  Transform::operator()(in_stack_000000f0,in_stack_000000e8);
  Vector3fi::Vector3fi((Vector3fi *)in_stack_fffffffffffffc50,(Vector3f *)in_stack_fffffffffffffc48)
  ;
  this_00 = (Interval<float> *)&stack0xffffffffffffff8c;
  Transform::operator()
            ((Transform *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (Vector3fi *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  i_00 = (Interval<float>)&stack0xffffffffffffff94;
  auVar7._0_8_ = SumSquares<float,pbrt::Interval<float>>(i,in_RDI);
  auVar7._8_56_ = extraout_var;
  local_a8 = vmovlpd_avx(auVar7._0_16_);
  local_d8 = local_44;
  auVar8._0_8_ = Interval<float>::operator*<float>(this_00,i_00);
  auVar8._8_56_ = extraout_var_00;
  local_d0 = vmovlpd_avx(auVar8._0_16_);
  local_e8 = local_3c;
  auVar9._0_8_ = Interval<float>::operator*<float>(this_00,i_00);
  auVar9._8_56_ = extraout_var_01;
  local_e0 = vmovlpd_avx(auVar9._0_16_);
  auVar10._0_8_ =
       Interval<float>::operator+<float>
                 ((Interval<float> *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                  in_stack_fffffffffffffc48);
  auVar10._8_56_ = extraout_var_02;
  local_c8 = vmovlpd_avx(auVar10._0_16_);
  uVar44 = 2;
  auVar11._0_8_ = pbrt::operator*((int)in_stack_fffffffffffffc44,in_stack_fffffffffffffc48);
  auVar11._8_56_ = extraout_var_03;
  local_c0 = vmovlpd_avx(auVar11._0_16_);
  local_100 = local_44;
  local_108 = local_3c;
  auVar12._0_8_ = SumSquares<float,pbrt::Interval<float>>(i,in_RDI);
  auVar12._8_56_ = extraout_var_04;
  local_f8 = vmovlpd_avx(auVar12._0_16_);
  Interval<float>::Interval(&local_118,*(float *)(in_RSI + 0x14));
  auVar13._0_8_ = Sqr<float>(in_stack_fffffffffffffc38);
  auVar13._8_56_ = extraout_var_05;
  local_110 = vmovlpd_avx(auVar13._0_16_);
  auVar14._0_8_ =
       Interval<float>::operator-<float>
                 ((Interval<float> *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                  in_stack_fffffffffffffc48);
  auVar14._8_56_ = extraout_var_06;
  local_f0 = vmovlpd_avx(auVar14._0_16_);
  local_130 = local_a8;
  auVar15._0_8_ = pbrt::operator*((int)in_stack_fffffffffffffc44,in_stack_fffffffffffffc48);
  auVar15._8_56_ = extraout_var_07;
  local_128 = vmovlpd_avx(auVar15._0_16_);
  auVar16._0_8_ =
       Interval<float>::operator/<float>
                 ((Interval<float> *)CONCAT44(uVar44,in_stack_fffffffffffffca0),i_01);
  auVar16._8_56_ = extraout_var_08;
  local_120 = vmovlpd_avx(auVar16._0_16_);
  auVar17._0_8_ = Interval<float>::operator*<float>(this_00,i_00);
  auVar17._8_56_ = extraout_var_09;
  local_140 = vmovlpd_avx(auVar17._0_16_);
  auVar18._0_8_ =
       Interval<float>::operator-<float>
                 ((Interval<float> *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                  in_stack_fffffffffffffc48);
  auVar18._8_56_ = extraout_var_10;
  local_138 = vmovlpd_avx(auVar18._0_16_);
  auVar19._0_8_ = Interval<float>::operator*<float>(this_00,i_00);
  auVar19._8_56_ = extraout_var_11;
  local_158 = vmovlpd_avx(auVar19._0_16_);
  auVar20._0_8_ =
       Interval<float>::operator-<float>
                 ((Interval<float> *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                  in_stack_fffffffffffffc48);
  auVar20._8_56_ = extraout_var_12;
  local_150 = vmovlpd_avx(auVar20._0_16_);
  local_180 = local_138;
  auVar21._0_8_ = Sqr<float>(in_stack_fffffffffffffc38);
  auVar21._8_56_ = extraout_var_13;
  local_178 = vmovlpd_avx(auVar21._0_16_);
  local_190 = local_150;
  auVar22._0_8_ = Sqr<float>(in_stack_fffffffffffffc38);
  auVar22._8_56_ = extraout_var_14;
  local_188 = vmovlpd_avx(auVar22._0_16_);
  auVar23._0_8_ =
       Interval<float>::operator+<float>
                 ((Interval<float> *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                  in_stack_fffffffffffffc48);
  auVar23._8_56_ = extraout_var_15;
  local_170 = vmovlpd_avx(auVar23._0_16_);
  auVar24._0_8_ = Sqrt<float>(in_stack_fffffffffffffc38);
  auVar24._8_56_ = extraout_var_16;
  local_168 = vmovlpd_avx(auVar24._0_16_);
  local_1b0 = local_a8;
  auVar25._0_8_ = pbrt::operator*((int)in_stack_fffffffffffffc44,in_stack_fffffffffffffc48);
  auVar25._8_56_ = extraout_var_17;
  local_1a8 = vmovlpd_avx(auVar25._0_16_);
  Interval<float>::Interval(&local_1c0,*(float *)(in_RSI + 0x14));
  local_1c8 = local_168;
  auVar26._0_8_ =
       Interval<float>::operator+<float>
                 ((Interval<float> *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                  in_stack_fffffffffffffc48);
  auVar26._8_56_ = extraout_var_18;
  local_1b8 = vmovlpd_avx(auVar26._0_16_);
  auVar27._0_8_ = Interval<float>::operator*<float>(this_00,i_00);
  auVar27._8_56_ = extraout_var_19;
  local_1a0 = vmovlpd_avx(auVar27._0_16_);
  Interval<float>::Interval(&local_1d8,*(float *)(in_RSI + 0x14));
  local_1e0 = local_168;
  auVar28._0_8_ =
       Interval<float>::operator-<float>
                 ((Interval<float> *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                  in_stack_fffffffffffffc48);
  auVar28._8_56_ = extraout_var_20;
  local_1d0 = vmovlpd_avx(auVar28._0_16_);
  auVar29._0_8_ = Interval<float>::operator*<float>(this_00,i_00);
  auVar29._8_56_ = extraout_var_21;
  local_198 = (Interval<float>)vmovlpd_avx(auVar29._0_16_);
  fVar3 = Interval<float>::LowerBound(&local_198);
  if (fVar3 < 0.0) {
    memset((void *)in_RDI,0,0x18);
    pstd::optional<pbrt::QuadricIntersection>::optional
              ((optional<pbrt::QuadricIntersection> *)in_RDI);
  }
  else {
    local_1f0 = local_198;
    auVar30._0_8_ = Sqrt<float>(in_stack_fffffffffffffc38);
    auVar30._8_56_ = extraout_var_22;
    local_1e8 = vmovlpd_avx(auVar30._0_16_);
    fVar3 = Interval::operator_cast_to_float((Interval<float> *)0x7ee7f8);
    if (0.0 <= fVar3) {
      local_228 = local_1e8;
      auVar33._0_8_ =
           Interval<float>::operator+<float>
                     ((Interval<float> *)
                      CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                      in_stack_fffffffffffffc48);
      auVar33._8_56_ = extraout_var_25;
      local_220 = vmovlpd_avx(auVar33._0_16_);
      auVar34._0_8_ = pbrt::operator*(in_stack_fffffffffffffc44,in_stack_fffffffffffffc48);
      auVar34._8_56_ = extraout_var_26;
      local_218 = vmovlpd_avx(auVar34._0_16_);
      local_1f8 = local_218;
    }
    else {
      local_210 = local_1e8;
      auVar31._0_8_ =
           Interval<float>::operator-<float>
                     ((Interval<float> *)
                      CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                      in_stack_fffffffffffffc48);
      auVar31._8_56_ = extraout_var_23;
      local_208 = vmovlpd_avx(auVar31._0_16_);
      auVar32._0_8_ = pbrt::operator*(in_stack_fffffffffffffc44,in_stack_fffffffffffffc48);
      auVar32._8_56_ = extraout_var_24;
      local_200 = vmovlpd_avx(auVar32._0_16_);
      local_1f8 = local_200;
    }
    local_238 = local_a8;
    auVar35._0_8_ =
         Interval<float>::operator/<float>
                   ((Interval<float> *)CONCAT44(uVar44,in_stack_fffffffffffffca0),i_01);
    auVar35._8_56_ = extraout_var_27;
    local_230 = (Interval<float>)vmovlpd_avx(auVar35._0_16_);
    local_248 = local_1f8;
    local_98[0] = local_230;
    auVar36._0_8_ =
         Interval<float>::operator/<float>
                   ((Interval<float> *)CONCAT44(uVar44,in_stack_fffffffffffffca0),i_01);
    auVar36._8_56_ = extraout_var_28;
    local_240 = (Interval<float>)vmovlpd_avx(auVar36._0_16_);
    local_a0 = local_240;
    fVar3 = Interval<float>::LowerBound(local_98);
    fVar4 = Interval<float>::LowerBound(&local_a0);
    if (fVar4 < fVar3) {
      pstd::swap<pbrt::Interval<float>>(local_98,&local_a0);
    }
    fVar3 = Interval<float>::UpperBound(local_98);
    if ((local_1c < fVar3) || (fVar3 = Interval<float>::LowerBound(&local_a0), fVar3 <= 0.0)) {
      memset((void *)in_RDI,0,0x18);
      pstd::optional<pbrt::QuadricIntersection>::optional
                ((optional<pbrt::QuadricIntersection> *)in_RDI);
    }
    else {
      local_250 = local_98[0];
      fVar3 = Interval<float>::LowerBound(&local_250);
      if (fVar3 <= 0.0) {
        local_250 = local_a0;
        fVar3 = Interval<float>::UpperBound(&local_250);
        if (local_1c < fVar3) {
          memset((void *)in_RDI,0,0x18);
          pstd::optional<pbrt::QuadricIntersection>::optional
                    ((optional<pbrt::QuadricIntersection> *)in_RDI);
          return (optional<pbrt::QuadricIntersection> *)i;
        }
      }
      fVar3 = (float)((ulong)local_268 >> 0x20);
      Point3<float>::Point3<pbrt::Interval<float>>
                ((Point3<float> *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                 (Point3<pbrt::Interval<float>_> *)in_stack_fffffffffffffc38);
      fVar5 = Interval::operator_cast_to_float((Interval<float> *)0x7eea76);
      t = &local_284;
      Vector3<float>::Vector3<pbrt::Interval<float>>
                ((Vector3<float> *)CONCAT44(fVar5,in_stack_fffffffffffffc40),
                 (Vector3<pbrt::Interval<float>_> *)in_stack_fffffffffffffc38);
      auVar41 = (undefined1  [56])0x0;
      VVar42 = pbrt::operator*(fVar3,t);
      local_290 = VVar42.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar37._0_8_ = VVar42.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar37._8_56_ = auVar41;
      local_298 = vmovlpd_avx(auVar37._0_16_);
      local_278 = local_298;
      local_270 = local_290;
      PVar43 = Point3<float>::operator+
                         ((Point3<float> *)CONCAT44(fVar5,in_stack_fffffffffffffc40),
                          (Vector3<float> *)in_stack_fffffffffffffc38);
      local_2a0 = PVar43.super_Tuple3<pbrt::Point3,_float>.z;
      auVar38._0_8_ = PVar43.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar38._8_56_ = auVar41;
      local_2a8 = vmovlpd_avx(auVar38._0_16_);
      local_2c._0_4_ = (float)local_2a8;
      local_2c._4_4_ = (float)((ulong)local_2a8 >> 0x20);
      auVar1 = vfmadd213ss_fma(ZEXT416((uint)(float)local_2c),ZEXT416((uint)(float)local_2c),
                               ZEXT416((uint)(local_2c._4_4_ * local_2c._4_4_)));
      local_25c = local_2a8;
      local_254 = local_2a0;
      local_2c = local_2a8;
      local_24 = local_2a0;
      dVar6 = std::sqrt(auVar1._0_8_);
      local_2ac = SUB84(dVar6,0);
      fVar4 = (*(float *)(in_RSI + 0x14) / local_2ac) * (float)local_2c;
      local_2c._4_4_ = (*(float *)(in_RSI + 0x14) / local_2ac) * local_2c._4_4_;
      local_2c = CONCAT44(local_2c._4_4_,fVar4);
      dVar6 = std::atan2((double)(ulong)(uint)local_2c._4_4_,(double)(ulong)(uint)fVar4);
      local_20 = SUB84(dVar6,0);
      if (local_20 < 0.0) {
        local_20 = local_20 + 6.2831855;
      }
      if (((local_24 < *(float *)(in_RSI + 0x18)) || (*(float *)(in_RSI + 0x1c) < local_24)) ||
         (*(float *)(in_RSI + 0x20) < local_20)) {
        local_2b8 = local_a0;
        bVar2 = Interval<float>::operator==(&local_250,local_a0);
        if (bVar2) {
          memset((void *)in_RDI,0,0x18);
          pstd::optional<pbrt::QuadricIntersection>::optional
                    ((optional<pbrt::QuadricIntersection> *)in_RDI);
          return (optional<pbrt::QuadricIntersection> *)i;
        }
        local_250 = local_a0;
        fVar4 = Interval<float>::UpperBound(&local_a0);
        if (local_1c < fVar4) {
          memset((void *)in_RDI,0,0x18);
          pstd::optional<pbrt::QuadricIntersection>::optional
                    ((optional<pbrt::QuadricIntersection> *)in_RDI);
          return (optional<pbrt::QuadricIntersection> *)i;
        }
        p = &local_2d0;
        Point3<float>::Point3<pbrt::Interval<float>>
                  ((Point3<float> *)CONCAT44(fVar5,in_stack_fffffffffffffc40),p);
        in_stack_fffffffffffffc2c = Interval::operator_cast_to_float((Interval<float> *)0x7eed09);
        in_stack_fffffffffffffc30 = (optional<pbrt::QuadricIntersection> *)local_2ec;
        Vector3<float>::Vector3<pbrt::Interval<float>>
                  ((Vector3<float> *)CONCAT44(fVar5,in_stack_fffffffffffffc40),
                   (Vector3<pbrt::Interval<float>_> *)p);
        auVar41 = (undefined1  [56])0x0;
        VVar42 = pbrt::operator*(fVar3,t);
        local_2ec._20_4_ = VVar42.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar39._0_8_ = VVar42.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar39._8_56_ = auVar41;
        local_2ec._12_8_ = vmovlpd_avx(auVar39._0_16_);
        PVar43 = Point3<float>::operator+
                           ((Point3<float> *)CONCAT44(fVar5,in_stack_fffffffffffffc40),
                            (Vector3<float> *)p);
        local_2d0.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high =
             PVar43.super_Tuple3<pbrt::Point3,_float>.z;
        auVar40._0_8_ = PVar43.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar40._8_56_ = auVar41;
        local_2d0.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._12_8_ =
             vmovlpd_avx(auVar40._0_16_);
        local_2c._0_4_ = local_2d0.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
        local_2c._4_4_ = local_2d0.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
        auVar1 = vfmadd213ss_fma(ZEXT416((uint)(float)local_2c),ZEXT416((uint)(float)local_2c),
                                 ZEXT416((uint)(local_2c._4_4_ * local_2c._4_4_)));
        local_2c = local_2d0.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._12_8_;
        local_24 = local_2d0.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
        dVar6 = std::sqrt(auVar1._0_8_);
        fVar3 = (*(float *)(in_RSI + 0x14) / SUB84(dVar6,0)) * (float)local_2c;
        local_2c._4_4_ = (*(float *)(in_RSI + 0x14) / SUB84(dVar6,0)) * local_2c._4_4_;
        local_2c = CONCAT44(local_2c._4_4_,fVar3);
        dVar6 = std::atan2((double)(ulong)(uint)local_2c._4_4_,(double)(ulong)(uint)fVar3);
        local_20 = SUB84(dVar6,0);
        if (local_20 < 0.0) {
          local_20 = local_20 + 6.2831855;
        }
        if (((local_24 < *(float *)(in_RSI + 0x18)) || (*(float *)(in_RSI + 0x1c) < local_24)) ||
           (*(float *)(in_RSI + 0x20) < local_20)) {
          memset((void *)in_RDI,0,0x18);
          pstd::optional<pbrt::QuadricIntersection>::optional
                    ((optional<pbrt::QuadricIntersection> *)in_RDI);
          return (optional<pbrt::QuadricIntersection> *)i;
        }
      }
      Interval::operator_cast_to_float((Interval<float> *)0x7eef09);
      pstd::optional<pbrt::QuadricIntersection>::optional
                (in_stack_fffffffffffffc30,
                 (QuadricIntersection *)
                 CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
    }
  }
  return (optional<pbrt::QuadricIntersection> *)i;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<QuadricIntersection> BasicIntersect(const Ray &r, Float tMax) const {
        Float phi;
        Point3f pHit;
        // Transform _Ray_ origin and direction to object space
        Point3fi oi = (*objectFromRender)(Point3fi(r.o));
        Vector3fi di = (*objectFromRender)(Vector3fi(r.d));

        // Solve quadratic equation to find cylinder _t0_ and _t1_ values
        FloatInterval t0, t1;
        // Compute cylinder quadratic coefficients
        FloatInterval a = SumSquares(di.x, di.y);
        FloatInterval b = 2 * (di.x * oi.x + di.y * oi.y);
        FloatInterval c = SumSquares(oi.x, oi.y) - Sqr(FloatInterval(radius));

        // Compute cylinder quadratic discriminant _discrim_
        FloatInterval f = b / (2 * a);
        FloatInterval fx = oi.x - f * di.x, fy = oi.y - f * di.y;
        FloatInterval sqrtf = Sqrt(Sqr(fx) + Sqr(fy));
        FloatInterval discrim =
            4 * a * (FloatInterval(radius) + sqrtf) * (FloatInterval(radius) - sqrtf);
        if (discrim.LowerBound() < 0)
            return {};

        // Compute quadratic $t$ values
        FloatInterval rootDiscrim = Sqrt(discrim);
        FloatInterval q;
        if ((Float)b < 0)
            q = -.5f * (b - rootDiscrim);
        else
            q = -.5f * (b + rootDiscrim);
        t0 = q / a;
        t1 = c / q;
        // Swap quadratic $t$ values so that _t0_ is the lesser
        if (t0.LowerBound() > t1.LowerBound())
            pstd::swap(t0, t1);

        // Check quadric shape _t0_ and _t1_ for nearest intersection
        if (t0.UpperBound() > tMax || t1.LowerBound() <= 0)
            return {};
        FloatInterval tShapeHit = t0;
        if (tShapeHit.LowerBound() <= 0) {
            tShapeHit = t1;
            if (tShapeHit.UpperBound() > tMax)
                return {};
        }

        // Compute cylinder hit point and $\phi$
        pHit = Point3f(oi) + (Float)tShapeHit * Vector3f(di);
        // Refine cylinder intersection point
        Float hitRad = std::sqrt(pHit.x * pHit.x + pHit.y * pHit.y);
        pHit.x *= radius / hitRad;
        pHit.y *= radius / hitRad;

        phi = std::atan2(pHit.y, pHit.x);
        if (phi < 0)
            phi += 2 * Pi;

        // Test cylinder intersection against clipping parameters
        if (pHit.z < zMin || pHit.z > zMax || phi > phiMax) {
            if (tShapeHit == t1)
                return {};
            tShapeHit = t1;
            if (t1.UpperBound() > tMax)
                return {};
            // Compute cylinder hit point and $\phi$
            pHit = Point3f(oi) + (Float)tShapeHit * Vector3f(di);
            // Refine cylinder intersection point
            Float hitRad = std::sqrt(pHit.x * pHit.x + pHit.y * pHit.y);
            pHit.x *= radius / hitRad;
            pHit.y *= radius / hitRad;

            phi = std::atan2(pHit.y, pHit.x);
            if (phi < 0)
                phi += 2 * Pi;

            if (pHit.z < zMin || pHit.z > zMax || phi > phiMax)
                return {};
        }

        // Return _QuadricIntersection_ for cylinder intersection
        return QuadricIntersection{(Float)tShapeHit, pHit, phi};
    }